

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_prefork8(tsdn_t *tsdn,arena_t *arena)

{
  arena_t *paVar1;
  arena_t *paVar2;
  ulong uVar3;
  arena_t *paVar4;
  szind_t i;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    if (duckdb_je_bin_infos[uVar5].n_shards != 0) {
      uVar3 = 0;
      paVar2 = arena;
      paVar4 = arena;
      do {
        paVar1 = paVar2;
        if (uVar5 < duckdb_je_bin_info_nbatched_sizes) {
          paVar1 = paVar4;
        }
        duckdb_je_bin_prefork
                  (tsdn,(bin_t *)((long)&paVar1->nthreads[0].repr +
                                 (ulong)duckdb_je_arena_bin_offsets[uVar5]),
                   uVar5 < duckdb_je_bin_info_nbatched_sizes);
        uVar3 = uVar3 + 1;
        paVar4 = (arena_t *)&(paVar4->stats).mutex_prof_data[6].n_owner_switches;
        paVar2 = (arena_t *)&(paVar2->stats).mutex_prof_data[0].max_n_thds;
      } while (uVar3 < duckdb_je_bin_infos[uVar5].n_shards);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x24);
  return;
}

Assistant:

void
arena_prefork8(tsdn_t *tsdn, arena_t *arena) {
	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_t *bin = arena_get_bin(arena, i, j);
			bin_prefork(tsdn, bin, arena_bin_has_batch(i));
		}
	}
}